

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O3

bool __thiscall Kumu::Timestamp::Unarchive(Timestamp *this,MemIOReader *Reader)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  byte_t *pbVar9;
  uint uVar10;
  uint uVar11;
  caltime local_3c;
  
  if (Reader == (MemIOReader *)0x0) {
    __assert_fail("Reader",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.cpp"
                  ,0x3dd,"virtual bool Kumu::Timestamp::Unarchive(MemIOReader *)");
  }
  uVar7 = Reader->m_capacity;
  uVar8 = Reader->m_size;
  if ((ulong)uVar8 + 2 <= (ulong)uVar7) {
    pbVar9 = Reader->m_p;
    uVar6 = *(ushort *)(pbVar9 + uVar8);
    Reader->m_size = uVar8 + 2;
    uVar10 = uVar8 + 3;
    if (uVar10 <= uVar7) {
      bVar1 = pbVar9[uVar8 + 2];
      Reader->m_size = uVar10;
      uVar11 = uVar8 + 4;
      if (uVar11 <= uVar7) {
        bVar2 = pbVar9[uVar10];
        Reader->m_size = uVar11;
        uVar10 = uVar8 + 5;
        if (uVar10 <= uVar7) {
          bVar3 = pbVar9[uVar11];
          Reader->m_size = uVar10;
          uVar11 = uVar8 + 6;
          if (uVar11 <= uVar7) {
            bVar4 = pbVar9[uVar10];
            Reader->m_size = uVar11;
            if (uVar8 + 7 <= uVar7) {
              bVar5 = pbVar9[uVar11];
              Reader->m_size = uVar8 + 7;
              if (uVar7 < uVar8 + 8) {
                return false;
              }
              Reader->m_size = uVar8 + 8;
              local_3c.date.year = (i32_t)(ushort)(uVar6 << 8 | uVar6 >> 8);
              local_3c.date.month = (i32_t)bVar1;
              local_3c.date.day = (i32_t)bVar2;
              local_3c.hour = (i32_t)bVar3;
              local_3c.minute = (i32_t)bVar4;
              local_3c.second = (i32_t)bVar5;
              local_3c.offset = 0;
              TAI::tai::operator=(&this->m_Timestamp,&local_3c);
              this->m_TZOffsetMinutes = 0;
              return true;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool
Kumu::Timestamp::Unarchive(MemIOReader* Reader)
{
  ui16_t year;
  ui8_t month, day, hour, minute, second, tick;

  assert(Reader);
  if ( ! Reader->ReadUi16BE(&year) ) return false;
  if ( ! Reader->ReadUi8(&month) ) return false;
  if ( ! Reader->ReadUi8(&day) ) return false;
  if ( ! Reader->ReadUi8(&hour) ) return false;
  if ( ! Reader->ReadUi8(&minute) ) return false;
  if ( ! Reader->ReadUi8(&second) ) return false;
  if ( ! Reader->ReadUi8(&tick) ) return false;
  SetComponents(year, month, day, hour, minute, second);
  return true;
}